

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::DiagnoseCycle(cmOrderDirectories *this)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  size_type sVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  reference pvVar5;
  reference ppcVar6;
  cmake *this_01;
  undefined1 local_1f0 [16];
  string local_1e0;
  undefined1 local_1c0 [8];
  ConflictPair *j;
  const_iterator __end2;
  const_iterator __begin2;
  ConflictList *__range2;
  ConflictList *clist;
  uint i;
  undefined1 local_188 [8];
  ostringstream e;
  cmOrderDirectories *this_local;
  
  if ((this->CycleDiagnosed & 1U) == 0) {
    this->CycleDiagnosed = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    poVar2 = std::operator<<((ostream *)local_188,"Cannot generate a safe ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Purpose);
    poVar2 = std::operator<<(poVar2," for target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2," because there is a cycle in the constraint graph:\n");
    for (clist._0_4_ = 0;
        sVar4 = std::
                vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                ::size(&this->ConflictGraph), (uint)clist < sVar4; clist._0_4_ = (uint)clist + 1) {
      this_00 = &std::
                 vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                 ::operator[](&this->ConflictGraph,(ulong)(uint)clist)->
                 super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
      poVar2 = std::operator<<((ostream *)local_188,"  dir ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)clist);
      poVar2 = std::operator<<(poVar2," is [");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->OriginalDirectories,(ulong)(uint)clist);
      poVar2 = std::operator<<(poVar2,(string *)pvVar5);
      std::operator<<(poVar2,"]\n");
      __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (this_00);
      j = (ConflictPair *)
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                         *)&j), bVar1) {
        local_1c0 = (undefined1  [8])
                    __gnu_cxx::
                    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator*(&__end2);
        poVar2 = std::operator<<((ostream *)local_188,"    dir ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)local_1c0);
        std::operator<<(poVar2," must precede it due to ");
        ppcVar6 = std::
                  vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                  ::operator[](&this->ConstraintEntries,(long)*(int *)((long)local_1c0 + 4));
        (*(*ppcVar6)->_vptr_cmOrderDirectoriesConstraint[2])(*ppcVar6,local_188);
        std::operator<<((ostream *)local_188,"\n");
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end2);
      }
    }
    std::operator<<((ostream *)local_188,"Some of these libraries may not be found correctly.");
    this_01 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f0);
    cmake::IssueMessage(this_01,WARNING,(string *)(local_1f0 + 0x10),
                        (cmListFileBacktrace *)local_1f0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1f0);
    std::__cxx11::string::~string((string *)(local_1f0 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  }
  return;
}

Assistant:

void cmOrderDirectories::DiagnoseCycle()
{
  // Report the cycle at most once.
  if (this->CycleDiagnosed) {
    return;
  }
  this->CycleDiagnosed = true;

  // Construct the message.
  std::ostringstream e;
  e << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because there is a cycle in the constraint graph:\n";

  // Display the conflict graph.
  for (unsigned int i = 0; i < this->ConflictGraph.size(); ++i) {
    ConflictList const& clist = this->ConflictGraph[i];
    e << "  dir " << i << " is [" << this->OriginalDirectories[i] << "]\n";
    for (ConflictPair const& j : clist) {
      e << "    dir " << j.first << " must precede it due to ";
      this->ConstraintEntries[j.second]->Report(e);
      e << "\n";
    }
  }
  e << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING, e.str(), this->Target->GetBacktrace());
}